

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_truncate(Pager *pPager,Pgno nPage)

{
  sqlite3_io_methods *psVar1;
  char *__s;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  i64 currentSize;
  long local_30;
  
  psVar1 = pPager->fd->pMethods;
  if (psVar1 == (sqlite3_io_methods *)0x0) {
    return 0;
  }
  if (0xfc < (byte)(pPager->eState - 4)) {
    return 0;
  }
  iVar3 = pPager->pageSize;
  __n = (size_t)iVar3;
  iVar2 = (*psVar1->xFileSize)(pPager->fd,&local_30);
  if (iVar2 != 0) {
    return iVar2;
  }
  lVar4 = nPage * __n;
  if (local_30 == lVar4) {
    return 0;
  }
  if (lVar4 < local_30) {
    iVar3 = (*pPager->fd->pMethods->xTruncate)(pPager->fd,lVar4);
  }
  else {
    if (lVar4 < (long)(local_30 + __n)) goto LAB_00148333;
    __s = pPager->pTmpSpace;
    memset(__s,0,__n);
    iVar3 = (*pPager->fd->pMethods->xWrite)(pPager->fd,__s,iVar3,lVar4 - __n);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
LAB_00148333:
  pPager->dbFileSize = nPage;
  return 0;
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );
  
  if( isOpen(pPager->fd) 
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN) 
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}